

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fits_parser_workfn(long totalrows,long offset,long firstrow,long nrows,int nCols,
                      iteratorCol *colData,void *userPtr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  int *piVar6;
  void *in_RCX;
  long in_RDX;
  long lVar7;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  long in_R9;
  long in_stack_00000008;
  int *in_stack_00000048;
  LONGLONG *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_0000005c;
  char *in_stack_00000060;
  fitsfile *in_stack_00000068;
  int nCopy;
  char undef;
  long zeros [4];
  void *Data0;
  ParseStatusVariables *pv;
  ParseData *lParse;
  iteratorCol *outcol;
  Node *result;
  long ntodo;
  long remain;
  long idx;
  long kk;
  long jj;
  int anyNullThisTime;
  int constant;
  int status;
  long in_stack_fffffffffffffee0;
  ulong in_stack_fffffffffffffee8;
  ParseData *in_stack_fffffffffffffef0;
  void *local_100;
  void *nulval;
  ulong in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  undefined1 *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  long local_c8;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined2 in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff4a;
  int *in_stack_ffffffffffffff50;
  void *local_68;
  long in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  iteratorCol *in_stack_ffffffffffffffb0;
  long lVar8;
  long lVar9;
  long lVar10;
  int nCols_00;
  int iVar11;
  int in_stack_ffffffffffffffc4;
  long local_20;
  int local_4;
  
  iVar11 = 0;
  nCols_00 = 0;
  lVar2 = *(long *)(in_stack_00000008 + 0x28);
  plVar4 = (long *)(in_stack_00000008 + 0x30);
  memset(&stack0xffffffffffffff48,0,0x20);
  if (DEBUG_PIXFILTER != 0) {
    printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",in_RDI,in_RSI
           ,in_RDX,in_RCX,(ulong)in_R8D);
  }
  lVar5 = in_R9 + (long)(int)(in_R8D - 1) * 0x110;
  if (in_RDX == in_RSI + 1) {
    *(long *)(in_stack_00000008 + 0x68) = in_stack_00000008;
    *(undefined4 *)(*(long *)(in_stack_00000008 + 0x68) + 0x20) = 0;
    for (in_stack_ffffffffffffffb0 = (iteratorCol *)0x0;
        (long)in_stack_ffffffffffffffb0 < (long)(int)in_R8D;
        in_stack_ffffffffffffffb0 = (iteratorCol *)((long)&in_stack_ffffffffffffffb0->fptr + 1)) {
      *(undefined8 *)(*(long *)(lVar2 + 0xa0) + (long)in_stack_ffffffffffffffb0 * 0x110 + 0x68) =
           *(undefined8 *)(in_R9 + (long)in_stack_ffffffffffffffb0 * 0x110 + 0x68);
    }
    if (*(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18) < 1) {
      if (*(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18) < 0) {
        *(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18) = in_RDI;
      }
      else {
        *(void **)(*(long *)(in_stack_00000008 + 0x68) + 0x18) = in_RCX;
      }
    }
    else {
      local_c8 = in_RDI;
      if (*(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18) <= in_RDI) {
        local_c8 = *(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18);
      }
      *(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18) = local_c8;
    }
    *(long *)(in_stack_00000008 + 0x48) =
         in_RDX + *(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18) + -1;
    if (*(long *)(*(long *)(in_stack_00000008 + 0x68) + 8) == 0) {
      if (*(int *)(lVar5 + 0x58) == 0) {
        ffpmsg((char *)0x13fb23);
        return 0x1b2;
      }
      *(undefined8 *)(in_stack_00000008 + 0x38) = *(undefined8 *)(lVar5 + 0x60);
      **(undefined4 **)(in_stack_00000008 + 0x68) = *(undefined4 *)(lVar5 + 0x54);
      in_stack_ffffffffffffffc4 = 0;
      *(undefined8 *)(in_stack_00000008 + 0x60) = 0;
      if (*(int *)(lVar2 + 0xdc) == 0) {
        if (*(long *)(*(long *)(lVar2 + 0xb0) + 0x30) != 0) {
          *(undefined8 *)(in_stack_00000008 + 0x60) =
               *(undefined8 *)(*(long *)(lVar2 + 0xb0) + 0x30);
        }
      }
      else {
        if (*(int *)(lVar5 + 0x58) != 3) {
          ffgknjj(in_stack_00000068,in_stack_00000060,in_stack_0000005c,in_stack_00000058,
                  in_stack_00000050,in_stack_00000048,(int *)zeros[0]);
        }
        if ((in_stack_ffffffffffffffc4 == 0x193) || (*(int *)(lVar5 + 0x58) == 3)) {
          iVar1 = **(int **)(in_stack_00000008 + 0x68);
          if (iVar1 == 0x15) {
            *(undefined8 *)(in_stack_00000008 + 0x60) = 0xffffffffffff8000;
          }
          else if (iVar1 == 0x1f) {
            *(undefined8 *)(in_stack_00000008 + 0x60) = 0xffffffff80000000;
          }
          else if (iVar1 == 0x29) {
            *(undefined8 *)(in_stack_00000008 + 0x60) = 0x8000000000000000;
          }
        }
      }
      *(undefined8 *)(in_stack_00000008 + 0x50) = *(undefined8 *)(lVar5 + 0x68);
    }
    else {
      *plVar4 = *(long *)(*(long *)(in_stack_00000008 + 0x68) + 8);
      if (*(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x10) == 0) {
        in_stack_ffffffffffffff28 = &stack0xffffffffffffff48;
      }
      else {
        in_stack_ffffffffffffff28 = *(undefined1 **)(*(long *)(in_stack_00000008 + 0x68) + 0x10);
      }
      *(undefined1 **)(in_stack_00000008 + 0x38) = in_stack_ffffffffffffff28;
      *(undefined8 *)(in_stack_00000008 + 0x50) =
           *(undefined8 *)(*(long *)(lVar2 + 0x38) + (long)*(int *)(lVar2 + 0x48) * 0x180 + 0x40);
    }
    in_stack_ffffffffffffff20 = (char *)(ulong)(**(int **)(in_stack_00000008 + 0x68) - 1);
    switch(in_stack_ffffffffffffff20) {
    case (char *)0x0:
    case (char *)0xa:
    case (char *)0xd:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 1;
      break;
    case (char *)0xf:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 8;
      break;
    case (char *)0x14:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 2;
      break;
    case (char *)0x1e:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 4;
      break;
    case (char *)0x28:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 8;
      break;
    case (char *)0x29:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 4;
      break;
    case (char *)0x50:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 8;
      break;
    case (char *)0x51:
      *(undefined4 *)(in_stack_00000008 + 0x40) = 8;
    }
    in_stack_ffffffffffffff1c =
         *(int *)(*(long *)(lVar2 + 0x38) + 0x3c + (long)*(int *)(lVar2 + 0x48) * 0x180);
    if (in_stack_ffffffffffffff1c == 0x102) {
      *(undefined8 *)(in_stack_00000008 + 0x58) = 1;
    }
    else if (in_stack_ffffffffffffff1c == 0x103) {
      *(undefined8 *)(in_stack_00000008 + 0x58) = 8;
    }
    else if (in_stack_ffffffffffffff1c == 0x104) {
      *(undefined8 *)(in_stack_00000008 + 0x58) = 8;
    }
  }
  if (*(long *)(*(long *)(in_stack_00000008 + 0x68) + 8) == 0) {
    *plVar4 = *(long *)(lVar5 + 0x60) + (long)*(int *)(in_stack_00000008 + 0x40);
    if ((*(int *)(lVar5 + 0x58) == 3) &&
       (*(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x10) != 0)) {
      *(undefined8 *)(in_stack_00000008 + 0x38) =
           *(undefined8 *)(*(long *)(in_stack_00000008 + 0x68) + 0x10);
    }
    else {
      in_stack_ffffffffffffff10 = (ulong)(**(int **)(in_stack_00000008 + 0x68) - 0xb);
      switch(in_stack_ffffffffffffff10) {
      case 0:
        **(undefined1 **)(in_stack_00000008 + 0x38) =
             (char)*(undefined8 *)(in_stack_00000008 + 0x60);
        break;
      case 3:
        **(undefined1 **)(in_stack_00000008 + 0x38) = 0x55;
        break;
      case 5:
        *(undefined1 *)**(undefined8 **)(in_stack_00000008 + 0x38) = 1;
        *(undefined1 *)(**(long **)(in_stack_00000008 + 0x38) + 1) = 0;
        break;
      case 10:
        **(undefined2 **)(in_stack_00000008 + 0x38) =
             (short)*(undefined8 *)(in_stack_00000008 + 0x60);
        break;
      case 0x14:
        **(undefined4 **)(in_stack_00000008 + 0x38) = (int)*(undefined8 *)(in_stack_00000008 + 0x60)
        ;
        break;
      case 0x1e:
        **(undefined8 **)(in_stack_00000008 + 0x38) = *(undefined8 *)(in_stack_00000008 + 0x60);
        break;
      case 0x1f:
        **(undefined4 **)(in_stack_00000008 + 0x38) = 0x8541f136;
        break;
      case 0x46:
        **(undefined8 **)(in_stack_00000008 + 0x38) = *(undefined8 *)(in_stack_00000008 + 0x60);
        break;
      case 0x47:
        **(undefined8 **)(in_stack_00000008 + 0x38) = 0xb8a83e285ebab4b7;
      }
    }
  }
  lVar3 = *plVar4;
  if ((*(long *)(in_stack_00000008 + 0x48) - in_RDX) + 1 <= (long)in_RCX) {
    in_RCX = (void *)((*(long *)(in_stack_00000008 + 0x48) - in_RDX) + 1);
  }
  nulval = in_RCX;
  Setup_DataArrays((ParseData *)CONCAT44(in_stack_ffffffffffffffc4,iVar11),nCols_00,
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_68 = in_RCX;
  local_20 = in_RDX;
  while (local_68 != (void *)0x0) {
    if ((long)local_68 < 10000) {
      local_100 = local_68;
    }
    else {
      local_100 = (void *)0x2710;
    }
    Evaluate_Parser(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    if (*(int *)(lVar2 + 0xe0) != 0) break;
    local_20 = (long)local_100 + local_20;
    local_68 = (void *)((long)local_68 - (long)local_100);
    piVar6 = (int *)(*(long *)(lVar2 + 0x38) + (long)*(int *)(lVar2 + 0x48) * 0x180);
    if (*piVar6 == -1000) {
      iVar11 = 1;
    }
    iVar1 = piVar6[0xf];
    if (iVar1 - 0x102U < 3) {
      if (iVar11 == 0) {
        if (*(long *)(in_stack_00000008 + 0x50) == *(long *)(piVar6 + 0x10)) {
          ffcvtn(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (int)(in_stack_ffffffffffffff10 >> 0x20),nulval,
                 (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (int *)CONCAT62(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff50);
        }
        else if (*(long *)(piVar6 + 0x10) == 1) {
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            for (lVar8 = 0; lVar8 < *(long *)(in_stack_00000008 + 0x50); lVar8 = lVar8 + 1) {
              ffcvtn(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (int)(in_stack_ffffffffffffff10 >> 0x20),nulval,
                     (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (int *)CONCAT62(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff50);
            }
          }
        }
        else {
          if (*(long *)(in_stack_00000008 + 0x50) < *(long *)(piVar6 + 0x10)) {
            in_stack_fffffffffffffef0 = *(ParseData **)(in_stack_00000008 + 0x50);
          }
          else {
            in_stack_fffffffffffffef0 = *(ParseData **)(piVar6 + 0x10);
          }
          in_stack_ffffffffffffff40 = (int)in_stack_fffffffffffffef0;
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            ffcvtn(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (int)(in_stack_ffffffffffffff10 >> 0x20),nulval,
                   (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (int *)CONCAT62(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff50);
            if ((long)in_stack_ffffffffffffff40 < *(long *)(in_stack_00000008 + 0x50)) {
              memset((void *)(*plVar4 +
                             (lVar10 * *(long *)(in_stack_00000008 + 0x50) +
                             (long)in_stack_ffffffffffffff40) *
                             (long)*(int *)(in_stack_00000008 + 0x40)),0,
                     (*(long *)(in_stack_00000008 + 0x50) - (long)in_stack_ffffffffffffff40) *
                     (long)*(int *)(in_stack_00000008 + 0x40));
            }
          }
        }
        if (0 < *piVar6) {
          if (*(long *)(piVar6 + 0x20) == 0) {
            printf("invalid free(result->value.data.ptr) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x4df);
          }
          else {
            free(*(void **)(piVar6 + 0x20));
          }
        }
      }
      else {
        in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 & 0xffffff;
        for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
          for (lVar8 = 0; lVar8 < *(long *)(in_stack_00000008 + 0x50); lVar8 = lVar8 + 1) {
            ffcvtn(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (int)(in_stack_ffffffffffffff10 >> 0x20),nulval,
                   (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (int *)CONCAT62(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff50);
          }
        }
      }
      if (*(int *)(lVar2 + 0xe0) == -0xb) {
        *(undefined4 *)(lVar2 + 0xe0) = 0x19c;
        ffpmsg((char *)0x1407e7);
      }
    }
    else if (iVar1 == 0x105) {
      if (**(int **)(in_stack_00000008 + 0x68) == 0x10) {
        if (iVar11 == 0) {
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            if (*(char *)(*(long *)(piVar6 + 0x1e) + lVar10) == '\0') {
              strcpy(*(char **)(*plVar4 + lVar10 * 8),
                     *(char **)(*(long *)(piVar6 + 0x20) + lVar10 * 8));
            }
            else {
              nCols_00 = 1;
              strcpy(*(char **)(*plVar4 + lVar10 * 8),
                     (char *)**(undefined8 **)(in_stack_00000008 + 0x38));
            }
          }
        }
        else {
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            strcpy(*(char **)(*plVar4 + lVar10 * 8),(char *)(piVar6 + 0x20));
          }
        }
      }
      else {
        ffpmsg((char *)0x140e65);
        *(undefined4 *)(lVar2 + 0xe0) = 0x1b0;
      }
      if (0 < *piVar6) {
        if (**(long **)(piVar6 + 0x20) == 0) {
          printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,0x535);
        }
        else {
          free((void *)**(undefined8 **)(piVar6 + 0x20));
        }
        if (*(long *)(piVar6 + 0x20) == 0) {
          printf("invalid free(result->value.data.strptr) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,0x536);
        }
        else {
          free(*(void **)(piVar6 + 0x20));
        }
      }
    }
    else if (iVar1 == 0x106) {
      in_stack_fffffffffffffee8 = (ulong)(**(int **)(in_stack_00000008 + 0x68) - 1);
      switch(in_stack_fffffffffffffee8) {
      case 0:
      case 0xd:
        if (iVar11 == 0) {
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            for (lVar8 = 0; lVar8 < *(long *)(piVar6 + 0x10); lVar8 = lVar8 + 1) {
              *(bool *)(*plVar4 + lVar8 + lVar10 * *(long *)(piVar6 + 0x10)) =
                   *(char *)(*(long *)(*(long *)(piVar6 + 0x20) + lVar10 * 8) + lVar8) == '1';
            }
          }
        }
        else {
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            for (lVar8 = 0; lVar8 < *(long *)(piVar6 + 0x10); lVar8 = lVar8 + 1) {
              *(bool *)(*plVar4 + lVar8 + lVar10 * *(long *)(piVar6 + 0x10)) =
                   *(char *)((long)piVar6 + lVar8 + 0x80) == '1';
            }
          }
        }
        break;
      default:
        ffpmsg((char *)0x140c57);
        *(undefined4 *)(lVar2 + 0xe0) = 0x1b0;
        break;
      case 10:
        lVar10 = -1;
        for (lVar8 = 0; lVar8 < (long)local_100; lVar8 = lVar8 + 1) {
          for (lVar9 = 0; lVar9 < *(long *)(piVar6 + 0x10); lVar9 = lVar9 + 1) {
            lVar7 = lVar10;
            if (lVar9 % 8 == 0) {
              lVar7 = lVar10 + 1;
              *(undefined1 *)(*plVar4 + 1 + lVar10) = 0;
            }
            if (iVar11 == 0) {
              if (*(char *)(*(long *)(*(long *)(piVar6 + 0x20) + lVar8 * 8) + lVar9) == '1') {
                *(byte *)(*plVar4 + lVar7) =
                     *(byte *)(*plVar4 + lVar7) | (byte)(0x80 >> ((byte)(lVar9 % 8) & 0x1f));
              }
            }
            else if (*(char *)((long)piVar6 + lVar9 + 0x80) == '1') {
              *(byte *)(*plVar4 + lVar7) =
                   *(byte *)(*plVar4 + lVar7) | (byte)(0x80 >> ((byte)(lVar9 % 8) & 0x1f));
            }
            lVar10 = lVar7;
          }
        }
        break;
      case 0xf:
        if (iVar11 == 0) {
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            strcpy(*(char **)(*plVar4 + lVar10 * 8),
                   *(char **)(*(long *)(piVar6 + 0x20) + lVar10 * 8));
          }
        }
        else {
          for (lVar10 = 0; lVar10 < (long)local_100; lVar10 = lVar10 + 1) {
            strcpy(*(char **)(*plVar4 + lVar10 * 8),(char *)(piVar6 + 0x20));
          }
        }
      }
      if (0 < *piVar6) {
        if (**(long **)(piVar6 + 0x20) == 0) {
          printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,0x51b);
        }
        else {
          free((void *)**(undefined8 **)(piVar6 + 0x20));
        }
        if (*(long *)(piVar6 + 0x20) == 0) {
          printf("invalid free(result->value.data.strptr) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,0x51c);
        }
        else {
          free(*(void **)(piVar6 + 0x20));
        }
      }
    }
    if (*(int *)(lVar2 + 0xe0) != 0) break;
    if ((piVar6[0xf] == 0x106) && (**(int **)(in_stack_00000008 + 0x68) == 0xb)) {
      in_stack_fffffffffffffee0 = (long)*(int *)(in_stack_00000008 + 0x40);
      *plVar4 = *plVar4 + in_stack_fffffffffffffee0 * ((*(long *)(piVar6 + 0x10) + 7) / 8) *
                          (long)local_100;
    }
    else if (piVar6[0xf] == 0x105) {
      *plVar4 = *plVar4 + (long)*(int *)(in_stack_00000008 + 0x40) * (long)local_100;
    }
    else {
      *plVar4 = *plVar4 + (long)*(int *)(in_stack_00000008 + 0x40) * (long)local_100 *
                          *(long *)(in_stack_00000008 + 0x50);
    }
  }
  if ((*(long *)(in_stack_00000008 + 0x38) != *(long *)(lVar5 + 0x60)) &&
     (lVar3 == *(long *)(lVar5 + 0x60) + (long)*(int *)(in_stack_00000008 + 0x40))) {
    if (**(int **)(in_stack_00000008 + 0x68) == 0x10) {
      **(undefined2 **)(lVar5 + 0x60) = *(undefined2 *)**(undefined8 **)(in_stack_00000008 + 0x38);
    }
    else {
      memcpy(*(void **)(lVar5 + 0x60),*(void **)(in_stack_00000008 + 0x38),
             (long)*(int *)(in_stack_00000008 + 0x40));
    }
  }
  if (nCols_00 == 0) {
    if (*(long *)(in_stack_00000008 + 0x38) == *(long *)(lVar5 + 0x60)) {
      if (**(int **)(in_stack_00000008 + 0x68) == 0x10) {
        *(undefined2 *)**(undefined8 **)(in_stack_00000008 + 0x38) = in_stack_ffffffffffffff48;
      }
      else {
        memcpy(*(void **)(in_stack_00000008 + 0x38),&stack0xffffffffffffff48,
               (long)*(int *)(in_stack_00000008 + 0x40));
      }
    }
  }
  else {
    *(undefined4 *)(*(long *)(in_stack_00000008 + 0x68) + 0x20) = 1;
  }
  if ((((*(int *)(lVar2 + 0xdc) == 0) || (local_20 + -1 != *(long *)(in_stack_00000008 + 0x48))) ||
      (*(int *)(lVar2 + 0xe0) != 0)) ||
     (in_RDI <= *(long *)(*(long *)(in_stack_00000008 + 0x68) + 0x18))) {
    local_4 = *(int *)(lVar2 + 0xe0);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int fits_parser_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which calls the parser and copies the results      */
/* into either an OutputCol or a data pointer supplied in the userPtr        */
/* structure.                                                                */
/*---------------------------------------------------------------------------*/
{
    int status, constant=0, anyNullThisTime=0;
    long jj, kk, idx, remain, ntodo;
    Node *result;
    iteratorCol * outcol;
    ParseData *lParse = ((parseInfo*)userPtr)->parseData;
    struct ParseStatusVariables *pv = &( ((parseInfo*)userPtr)->parseVariables );
    void *Data0 = 0;

    /* declare variables static to preserve their values between calls */
    long zeros[4] = {0,0,0,0};

    if (DEBUG_PIXFILTER)
       printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",
                totalrows, offset, firstrow, nrows, nCols);
    /*--------------------------------------------------------*/
    /*  Initialization procedures: execute on the first call  */
    /*--------------------------------------------------------*/
    outcol = colData + (nCols - 1);
    if (firstrow == offset+1)
    {
       (pv->userInfo) = (parseInfo*)userPtr;
       (pv->userInfo)->anyNull = 0;

       /* Unfortunately there are two copies of the iterator columns,
	  one inside the parser and one outside maintained by the
	  higher level.  (This could happen if the histogramming
	  routines are binning multiple columns, and so there are
	  multiple parsers being managed at one time.) Upon the first
	  call we make sure they match */
       for (jj = 0; jj<nCols; jj++) {
	 lParse->colData[jj].repeat = colData[jj].repeat;
       }

       if( (pv->userInfo)->maxRows>0 )
          (pv->userInfo)->maxRows = minvalue(totalrows,(pv->userInfo)->maxRows);
       else if( (pv->userInfo)->maxRows<0 )
          (pv->userInfo)->maxRows = totalrows;
       else
          (pv->userInfo)->maxRows = nrows;

       (pv->lastRow) = firstrow + (pv->userInfo)->maxRows - 1;

       /* dataPtr == NULL indicates an iterator-derived column, which
	  means that the first value will be a null value and the remaining
	  values will be the where the outputs are placed */
       if( (pv->userInfo)->dataPtr==NULL ) {

          if( outcol->iotype == InputCol ) {
             ffpmsg("Output column for parser results not found!");
             return( PARSE_NO_OUTPUT );
          }
          /* Data gets set later */
          (pv->Null) = outcol->array;
          (pv->userInfo)->datatype = outcol->datatype;

          /* Check for a TNULL/BLANK keyword for output column/image */

          status = 0;
          (pv->jnull) = 0;
          if (lParse->hdutype == IMAGE_HDU) {
             if (lParse->pixFilter->blank)
                (pv->jnull) = (LONGLONG) lParse->pixFilter->blank;
          }
          else {
	    if (outcol->iotype != TemporaryCol) {
	      ffgknjj( outcol->fptr, "TNULL", outcol->colnum,
		       1, &(pv->jnull), (int*)&jj, &status );
	    }

             if( status==BAD_INTKEY || outcol->iotype == TemporaryCol) {
                /*  Probably ASCII table with text TNULL keyword  */
                switch( (pv->userInfo)->datatype ) {
                   case TSHORT:  (pv->jnull) = (LONGLONG) SHRT_MIN;      break;
                   case TINT:    (pv->jnull) = (LONGLONG) INT_MIN;       break;
                   case TLONG:   (pv->jnull) = (LONGLONG) LONG_MIN;      break;
                }
             }
          }
          (pv->repeat) = outcol->repeat;
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/
       } else {

	  /* This clause applies if the user is passing user-allocated 
	     data arrays, which is where the data will be placed.  This 
	     means they should also be passing null values */
          (pv->Data) = (pv->userInfo)->dataPtr;
          (pv->Null) = ((pv->userInfo)->nullPtr ? (pv->userInfo)->nullPtr : zeros);
          (pv->repeat) = lParse->Nodes[lParse->resultNode].value.nelem;

       }

       /* Determine the size of each element of the returned result */

       switch( (pv->userInfo)->datatype ) {
       case TBIT:       /*  Fall through to TBYTE  */
       case TLOGICAL:   /*  Fall through to TBYTE  */
       case TBYTE:     (pv->datasize) = sizeof(char);     break;
       case TSHORT:    (pv->datasize) = sizeof(short);    break;
       case TINT:      (pv->datasize) = sizeof(int);      break;
       case TLONG:     (pv->datasize) = sizeof(long);     break;
       case TLONGLONG: (pv->datasize) = sizeof(LONGLONG); break;
       case TFLOAT:    (pv->datasize) = sizeof(float);    break;
       case TDOUBLE:   (pv->datasize) = sizeof(double);   break;
       case TSTRING:   (pv->datasize) = sizeof(char*);    break;
       }

       /* Determine the size of each element of the calculated result */
       /*   (only matters for numeric/logical data)                   */

       switch( lParse->Nodes[lParse->resultNode].type ) {
       case BOOLEAN:   (pv->resDataSize) = sizeof(char);    break;
       case LONG:      (pv->resDataSize) = sizeof(long);    break;
       case DOUBLE:    (pv->resDataSize) = sizeof(double);  break;
       }
    }

    /*-------------------------------------------*/
    /*  Main loop: process all the rows of data  */
    /*-------------------------------------------*/

    /*  If writing to output column, set first element to appropriate  */
    /*  null value.  If no NULLs encounter, zero out before returning. */
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/

    if( (pv->userInfo)->dataPtr == NULL ) {
       /* First, reset Data pointer to start of output array, plus 1
	  because the 0th element is the null value (cute undocumented
	  feature of the iterator!) */
       (pv->Data) = (char*) outcol->array + (pv->datasize);

       /* A TemporaryCol with null value specified explicitly */
       if (outcol->iotype == TemporaryCol && (pv->userInfo)->nullPtr) {

	 pv->Null = (pv->userInfo)->nullPtr;

       } else {

	 /* ... or an OutputCol or TemporaryCol with no explicit null */
	 switch( (pv->userInfo)->datatype ) {
	 case TLOGICAL: *(char  *)(pv->Null) = 'U';             break;
	 case TBYTE:    *(char  *)(pv->Null) = (char )(pv->jnull);    break;
	 case TSHORT:   *(short *)(pv->Null) = (short)(pv->jnull);    break;
	 case TINT:     *(int   *)(pv->Null) = (int  )(pv->jnull);    break;
	 case TLONG:    *(long  *)(pv->Null) = (long )(pv->jnull);    break;
	 case TLONGLONG: *(LONGLONG  *)(pv->Null) = (LONGLONG )(pv->jnull);    break;
	 case TFLOAT:   *(float *)(pv->Null) = FLOATNULLVALUE;  break;
	 case TDOUBLE:  *(double*)(pv->Null) = DOUBLENULLVALUE; break;
	 case TSTRING: (*(char **)(pv->Null))[0] = '\1';
	               (*(char **)(pv->Null))[1] = '\0';        break;
	 }
       }
    }

    /* Alter nrows in case calling routine didn't want to do all rows */

    Data0 = pv->Data; /* Record starting point */
    nrows = minvalue(nrows,(pv->lastRow)-firstrow+1);

    Setup_DataArrays( lParse, nCols, colData, firstrow, nrows );

    /* Parser allocates arrays for each column and calculation it performs. */
    /* Limit number of rows processed during each pass to reduce memory     */
    /* requirements... In most cases, iterator will limit rows to less      */
    /* than 10000 rows per iteration, so this is really only relevant for    */
    /* hk-compressed files which must be decompressed in memory and sent    */
    /* whole to fits_parser_workfn in a single iteration.                           */

    remain = nrows;
    while( remain ) {
       ntodo = minvalue(remain,10000);
       Evaluate_Parser ( lParse, firstrow, ntodo );
       if( lParse->status ) break;

       firstrow += ntodo;
       remain   -= ntodo;

       /*  Copy results into data array  */

       result = lParse->Nodes + lParse->resultNode;
       if( result->operation==CONST_OP ) constant = 1;

       switch( result->type ) {

       case BOOLEAN:
       case LONG:
       case DOUBLE:
          if( constant ) {
             char undef=0;
             for( kk=0; kk<ntodo; kk++ )
                for( jj=0; jj<(pv->repeat); jj++ )
                   ffcvtn( lParse->datatype,
                           &(result->value.data),
                           &undef, result->value.nelem /* 1 */,
                           (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
          } else {
             if ( (pv->repeat) == result->value.nelem ) {
                ffcvtn( lParse->datatype,
                        result->value.data.ptr,
                        result->value.undef,
                        result->value.nelem*ntodo,
                        (pv->userInfo)->datatype, (pv->Null), (pv->Data),
                        &anyNullThisTime, &lParse->status );
             } else if( result->value.nelem == 1 ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<(pv->repeat); jj++ ) {
                      ffcvtn( lParse->datatype,
                              (char*)result->value.data.ptr + kk*(pv->resDataSize),
                              (char*)result->value.undef + kk,
                              1, (pv->userInfo)->datatype, (pv->Null),
                              (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                              &anyNullThisTime, &lParse->status );
                   }
             } else {
                int nCopy;
                nCopy = minvalue( (pv->repeat), result->value.nelem );
                for( kk=0; kk<ntodo; kk++ ) {
                   ffcvtn( lParse->datatype,
                           (char*)result->value.data.ptr
                                  + kk*result->value.nelem*(pv->resDataSize),
                           (char*)result->value.undef
                                  + kk*result->value.nelem,
                           nCopy, (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat))*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
                   if( nCopy < (pv->repeat) ) {
                      memset( (char*)(pv->Data) + (kk*(pv->repeat)+nCopy)*(pv->datasize),
                              0, ((pv->repeat)-nCopy)*(pv->datasize));
                   }
                }

             }
             if( result->operation>0 ) {
                FREE( result->value.data.ptr );
             }
          }
          if( lParse->status==OVERFLOW_ERR ) {
             lParse->status = NUM_OVERFLOW;
             ffpmsg("Numerical overflow while converting expression to necessary datatype");
          }
          break;

       case BITSTR:
          switch( (pv->userInfo)->datatype ) {
          case TBYTE:
             idx = -1;
             for( kk=0; kk<ntodo; kk++ ) {
                for( jj=0; jj<result->value.nelem; jj++ ) {
                   if( jj%8 == 0 )
                      ((char*)(pv->Data))[++idx] = 0;
                   if( constant ) {
                      if( result->value.data.str[jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   } else {
                      if( result->value.data.strptr[kk][jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   }
                }
             }
             break;
          case TBIT:
          case TLOGICAL:
             if( constant ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.str[jj]=='1' );
                   }
             } else {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.strptr[kk][jj]=='1' );
                   }
             }
             break; 
          case TSTRING:
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
                }
             } else {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.strptr[jj] );
                }
             }
             break;
          default:
             ffpmsg("Cannot convert bit expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
             break;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;

       case STRING:
          if( (pv->userInfo)->datatype==TSTRING ) {
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ )
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
             } else {
                for( jj=0; jj<ntodo; jj++ )
                   if( result->value.undef[jj] ) {
                      anyNullThisTime = 1;
                      strcpy( ((char**)(pv->Data))[jj],
                              *(char **)(pv->Null) );
                   } else {
                      strcpy( ((char**)(pv->Data))[jj],
                              result->value.data.strptr[jj] );
                   }
             }
          } else {
             ffpmsg("Cannot convert string expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;
       }

       if( lParse->status ) break;

       /*  Increment Data to point to where the next block should go  */

       if( result->type==BITSTR && (pv->userInfo)->datatype==TBYTE )
          (pv->Data) = (char*)(pv->Data)
                    + (pv->datasize) * ( (result->value.nelem+7)/8 ) * ntodo;
       else if( result->type==STRING )
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo;
       else
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo * (pv->repeat);
    }

    /* If a TemporaryCol output is used, we want to inform the caller
       what the null value is expected to be */
    if (pv->Null != outcol->array && 
	(Data0) == (char*) outcol->array + (pv->datasize)) {
      if( (pv->userInfo)->datatype == TSTRING )
	memcpy( outcol->array, *(char **)(pv->Null), 2 );
      else 
	memcpy( outcol->array, (pv->Null), (pv->datasize) );
    }

    /* If no NULLs encountered during this pass, set Null value to */
    /* zero to make the writing of the output column data faster   */

    if( anyNullThisTime )
       (pv->userInfo)->anyNull = 1;
    else if( pv->Null == outcol->array ) {
       if( (pv->userInfo)->datatype == TSTRING )
          memcpy( *(char **)(pv->Null), zeros, 2 );
       else 
          memcpy( (pv->Null), zeros, (pv->datasize) );
    }

    /*-------------------------------------------------------*/
    /*  Clean up procedures:  after processing all the rows  */
    /*-------------------------------------------------------*/

    /*  if the calling routine specified that only a limited number    */
    /*  of rows in the table should be processed, return a value of -1 */
    /*  once all the rows have been done, if no other error occurred.  */

    if (lParse->hdutype != IMAGE_HDU && firstrow - 1 == (pv->lastRow)) {
           if (!lParse->status && (pv->userInfo)->maxRows<totalrows) {
                  return (-1);
           }
    }

    return(lParse->status);  /* return successful status */
}